

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O2

void gethooktable(lua_State *L)

{
  int iVar1;
  
  lua_pushlightuserdata(L,"hio");
  lua_rawget(L,-10000);
  iVar1 = lua_type(L,-1);
  if (iVar1 == 5) {
    return;
  }
  lua_settop(L,-2);
  lua_createtable(L,0,1);
  lua_pushlightuserdata(L,"hio");
  lua_pushvalue(L,-2);
  lua_rawset(L,-10000);
  return;
}

Assistant:

static void gethooktable (lua_State *L) {
  lua_pushlightuserdata(L, (void *)&KEY_HOOK);
  lua_rawget(L, LUA_REGISTRYINDEX);
  if (!lua_istable(L, -1)) {
    lua_pop(L, 1);
    lua_createtable(L, 0, 1);
    lua_pushlightuserdata(L, (void *)&KEY_HOOK);
    lua_pushvalue(L, -2);
    lua_rawset(L, LUA_REGISTRYINDEX);
  }
}